

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O1

map_t * remap_init(uint32 n_hashed)

{
  uint uVar1;
  map_t *pmVar2;
  mapping_t *pmVar3;
  uint32 *puVar4;
  uint uVar5;
  size_t sVar6;
  uint32 l;
  ulong n_elem;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar1 = n_hashed * 3;
  n_elem = (ulong)uVar1;
  do {
    dVar10 = (double)n_elem;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = ceil(dVar10);
    uVar9 = 2;
    uVar5 = (uint)(long)dVar10;
    uVar8 = 2;
    if (2 < uVar5) {
      do {
        if ((int)(n_elem % uVar9) == 0) {
          n_elem = (ulong)((int)n_elem + 1);
          uVar8 = (uint)uVar9;
          break;
        }
        uVar7 = (uint)uVar9 + 1;
        uVar9 = (ulong)uVar7;
        uVar8 = uVar5;
      } while (uVar5 != uVar7);
    }
    uVar7 = (uint)n_elem;
    if (uVar8 == uVar5) goto LAB_0012939f;
  } while (uVar7 != uVar1);
  fprintf(_stderr,"next_prime: failed to find next prime for %d\n",(ulong)uVar1);
LAB_0012939f:
  pmVar2 = (map_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                                   ,0x62);
  pmVar3 = (mapping_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,100);
  pmVar2->map = pmVar3;
  puVar4 = (uint32 *)
           __ckd_calloc__((ulong)n_hashed,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,0x65);
  pmVar2->inv = puVar4;
  pmVar2->n_map = uVar7;
  if (uVar7 != 0) {
    pmVar3 = pmVar2->map;
    sVar6 = 0;
    do {
      pmVar3[sVar6].x = 0xffffffff;
      sVar6 = sVar6 + 1;
    } while (n_elem != sVar6);
  }
  return pmVar2;
}

Assistant:

map_t *
remap_init(uint32 n_hashed)
{
    map_t *new;
    unsigned int i;
    uint32 size;

    size = next_prime(n_hashed * 3);

    new = ckd_calloc(1, sizeof(map_t));

    new->map = ckd_calloc(size, sizeof(mapping_t));
    new->inv = ckd_calloc(n_hashed, sizeof(uint32));
    new->n_map = size;

    for (i = 0; i < size; i++) {
	new->map[i].x = FREE_MAPPING;
    }

    return new;
}